

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void server::privilegemsg(int min_privilege,char *fmt,...)

{
  long lVar1;
  char in_AL;
  int iVar2;
  undefined8 in_RCX;
  long lVar3;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar4;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_f8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_f8.reg_save_area = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_f8.overflow_arg_area = &ap[0].overflow_arg_area;
  local_f8.gp_offset = 0x10;
  local_f8.fp_offset = 0x30;
  if (0 < DAT_00193844) {
    lVar4 = 0;
    lVar3 = clients;
    iVar2 = DAT_00193844;
    local_c8 = in_RDX;
    local_c0 = in_RCX;
    local_b8 = in_R8;
    local_b0 = in_R9;
    do {
      lVar1 = *(long *)(lVar3 + lVar4 * 8);
      if (min_privilege <= *(int *)(lVar1 + 0x334)) {
        vmessage(*(int *)(lVar1 + 8),fmt,&local_f8);
        lVar3 = clients;
        iVar2 = DAT_00193844;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  return;
}

Assistant:

void privilegemsg(int min_privilege, const char *fmt, ...) {
        va_list ap;
        va_start(ap, fmt);
        loopv(clients) if(clients[i]->privilege >= min_privilege && clients[i]) vmessage(clients[i]->clientnum, fmt, ap);
        va_end(ap);
    }